

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

iter_result_opt * __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::gte_key_byte(iter_result_opt *__return_storage_ptr__,
              basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
              *this,byte key_byte)

{
  byte bVar1;
  key_prefix_snapshot kVar2;
  long lVar3;
  undefined4 local_e;
  undefined2 local_a;
  
  if (this->field_0x20 != '\0') {
    lVar3 = 0;
    do {
      bVar1 = *(byte *)((long)(this->children)._M_elems + lVar3 + -4);
      if (key_byte <= bVar1) {
        kVar2 = *(key_prefix_snapshot *)&this->field_0x18;
        (__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _M_payload._M_value.node.tagged_ptr = (ulong)this | 1;
        (__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _M_payload._M_value.key_byte = bVar1;
        (__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _M_payload._M_value.child_index = (uint8_t)lVar3;
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                 ._M_payload + 10) = local_e;
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                 ._M_payload + 0xe) = local_a;
        (__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _M_payload._M_value.prefix = kVar2;
        (__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _M_engaged = true;
        return __return_storage_ptr__;
      }
      lVar3 = lVar3 + 1;
    } while (this->field_0x20 != (char)lVar3);
  }
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.node.tagged_ptr = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
           )._M_payload.
           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
           ._M_payload + 8) = 0;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.prefix.u64 = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_engaged = 0;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_4::iter_result_opt
  gte_key_byte(std::byte key_byte) noexcept {
    const auto nchildren{this->children_count.load()};
    for (std::uint8_t i = 0; i < nchildren; ++i) {
      const auto key = keys.byte_array[i].load();
      if (key >= key_byte) {
        return {{node_ptr{this, node_type::I4}, key, i,
                 this->get_key_prefix().get_snapshot()}};
      }
    }
    // This should only occur if there is no entry in the keys[] which
    // is greater-than the given [key_byte].
    return parent_class::end_result;
  }